

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCommandResultMultiSuccessNoErrors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  VulkanHppGenerator *this_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  undefined8 uVar4;
  size_t in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0;
  allocator_type local_10b;
  Flags<CommandFlavourFlagBits> local_10a;
  allocator_type local_109;
  vector<unsigned_long,_std::allocator<unsigned_long>_> constPointerParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  undefined2 local_d2;
  string *local_d0;
  size_t local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_78;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  
  params = &commandData->params;
  local_d0 = name;
  local_c8 = initialSkipCount;
  determineReturnParams(&returnParams,this,params);
  lVar3 = (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar3 == 2) {
    this_00 = (commandData->successCodes).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((((((long)(commandData->successCodes).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x40) &&
          (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(this_00,"VK_SUCCESS"), iVar2 == 0)) &&
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((commandData->successCodes).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1,"VK_INCOMPLETE"), iVar2 == 0
         )) && ((iVar2 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*returnParams.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start].type.type,"size_t"
                                   ), iVar2 == 0 ||
                (iVar2 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*returnParams.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start].type.type,
                                    "uint32_t"), iVar2 == 0)))) &&
       ((iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&(params->
                          super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                          )._M_impl.super__Vector_impl_data._M_start
                          [returnParams.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[1]].type.type,"void"), iVar2 != 0 &&
        ((bVar1 = isHandleType(this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [returnParams.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]].type.type),
         !bVar1 && (bVar1 = isStructureChainAnchor
                                      (this,&(params->
                                             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                             )._M_impl.super__Vector_impl_data._M_start
                                             [returnParams.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1]].type.
                                             type), !bVar1)))))) {
      determineVectorParams(&vectorParams,this,params);
      if ((vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
         (((_Base_ptr)
           *returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
           vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent &&
          (returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[1] ==
           *(unsigned_long *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1)
          )))) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,&returnParams);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_60,&vectorParams._M_t);
        local_d2 = 0x1001;
        __l._M_len = 2;
        __l._M_array = (iterator)&local_d2;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&constPointerParams,__l,&local_109);
        local_10a.m_mask = '\x01';
        uVar4 = 0x162fd6;
        __l_00._M_len = 1;
        __l_00._M_array = &local_10a;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_78,__l_00,&local_10b);
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_60;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_c0;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = (char)&local_78
        ;
        vectorParams_00._M_t._M_impl._0_24_ =
             ZEXT924(CONCAT18(raii,(vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                    *)&constPointerParams));
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
             (int7)((ulong)&local_78 >> 8);
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffee8
        ;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,local_d0,commandData,local_c8,definition,
                   returnParams_00,vectorParams_00,(bool)in_stack_fffffffffffffef0,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)constPointerParams.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                   (bool)constPointerParams.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish._0_1_,
                   (bool)constPointerParams.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_1_,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start);
        if (local_78.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (constPointerParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(constPointerParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          CONCAT71(constPointerParams.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   constPointerParams.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                          (long)constPointerParams.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_60);
        if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
LAB_00162e2b:
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&vectorParams._M_t);
        goto LAB_00162d87;
      }
      goto LAB_00162d1c;
    }
  }
  else if (lVar3 == 0) {
    this_01 = this;
    determineVectorParams(&vectorParams,this,params);
    if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      determineConstPointerParams(&constPointerParams,this_01,params);
      if (constPointerParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pointer)CONCAT71(constPointerParams.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish._1_7_,
                            constPointerParams.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_1_)) {
        generateCommandSetExclusive
                  (__return_storage_ptr__,this,local_d0,commandData,local_c8,definition,raii);
        if (constPointerParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(constPointerParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          CONCAT71(constPointerParams.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   constPointerParams.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                          (long)constPointerParams.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00162e2b;
      }
      if (constPointerParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(constPointerParams.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        CONCAT71(constPointerParams.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 constPointerParams.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                        (long)constPointerParams.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
LAB_00162d1c:
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&vectorParams._M_t);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00162d87:
  if (returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)returnParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)returnParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultMultiSuccessNoErrors(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0:
      {
        std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
        if ( vectorParams.empty() )
        {
          std::vector<size_t> constPointerParams = determineConstPointerParams( commandData.params );
          if ( constPointerParams.empty() )
          {
            return generateCommandSetExclusive( name, commandData, initialSkipCount, definition, raii );
          }
        }
      }
      break;
    case 2:
      if ( ( commandData.successCodes.size() == 2 ) && ( commandData.successCodes[0] == "VK_SUCCESS" ) && ( commandData.successCodes[1] == "VK_INCOMPLETE" ) )
      {
        if ( ( commandData.params[returnParams[0]].type.type == "size_t" ) || ( commandData.params[returnParams[0]].type.type == "uint32_t" ) )
        {
          if ( ( commandData.params[returnParams[1]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[1]].type.type ) &&
               !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
          {
            std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
            if ( vectorParams.size() == 1 )
            {
              if ( returnParams[0] == vectorParams.begin()->second.lenParam )
              {
                if ( returnParams[1] == vectorParams.begin()->first )
                {
                  return generateCommandSetInclusive( name,
                                                      commandData,
                                                      initialSkipCount,
                                                      definition,
                                                      returnParams,
                                                      vectorParams,
                                                      false,
                                                      { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                                      raii,
                                                      false,
                                                      { CommandFlavourFlagBits::enhanced } );
                }
              }
            }
          }
        }
      }
      break;
    default: break;
  }
  return "";
}